

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

void Abc_AigSetNodePhases(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  undefined8 *puVar5;
  int iVar6;
  long lVar7;
  Vec_Ptr_t *pVVar8;
  char *__assertion;
  
  iVar6 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar6 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                  ,0x571,"void Abc_AigSetNodePhases(Abc_Ntk_t *)");
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                  ,0x2ad,"Abc_Obj_t *Abc_AigConst1(Abc_Ntk_t *)");
  }
  puVar1 = (uint *)(*(long *)((long)pNtk->pManFunc + 8) + 0x14);
  *puVar1 = *puVar1 | 0x80;
  pVVar8 = pNtk->vPis;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      puVar1 = (uint *)((long)pVVar8->pArray[lVar7] + 0x14);
      *puVar1 = *puVar1 & 0xffffff7f;
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vPis;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vBoxes;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar7];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
        lVar4 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8);
        if ((*(uint *)(lVar4 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,0x1a9,"int Abc_LatchIsInit1(Abc_Obj_t *)");
        }
        *(uint *)(lVar4 + 0x14) =
             *(uint *)(lVar4 + 0x14) & 0xffffff78 | (uint)(*(long *)(lVar4 + 0x38) == 2) << 7;
      }
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vBoxes;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      puVar5 = (undefined8 *)pVVar8->pArray[lVar7];
      if (puVar5 != (undefined8 *)0x0) {
        if (((ulong)puVar5 & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_00830d23:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (*(int *)*puVar5 != 3) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_00830d23;
        }
        if (*(int *)((long)puVar5 + 0x1c) == 2) {
          lVar4 = *(long *)(*(long *)((int *)*puVar5 + 8) + 8);
          uVar2 = *(uint *)((long)puVar5 + 0x14);
          *(uint *)((long)puVar5 + 0x14) =
               uVar2 & 0xffffff7f |
               ((uVar2 >> 0xb ^
                *(uint *)(*(long *)(lVar4 + (long)((int *)puVar5[4])[1] * 8) + 0x14) >> 7) &
                (uVar2 >> 10 ^ *(uint *)(*(long *)(lVar4 + (long)*(int *)puVar5[4] * 8) + 0x14) >> 7
                ) & 1) << 7;
        }
      }
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vPos;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar7];
      *(uint *)((long)plVar3 + 0x14) =
           *(uint *)((long)plVar3 + 0x14) & 0xffffff7f |
           (*(uint *)((long)plVar3 + 0x14) >> 3 ^
           *(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                              (long)*(int *)plVar3[4] * 8) + 0x14)) & 0x80;
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vPos;
    } while (lVar7 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vBoxes;
  if (0 < pVVar8->nSize) {
    lVar7 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar7];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
        plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
        *(uint *)((long)plVar3 + 0x14) =
             *(uint *)((long)plVar3 + 0x14) & 0xffffff7f |
             (*(uint *)((long)plVar3 + 0x14) >> 3 ^
             *(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                (long)*(int *)plVar3[4] * 8) + 0x14)) & 0x80;
      }
      lVar7 = lVar7 + 1;
      pVVar8 = pNtk->vBoxes;
    } while (lVar7 < pVVar8->nSize);
  }
  return;
}

Assistant:

void Abc_AigSetNodePhases( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    Abc_AigConst1(pNtk)->fPhase = 1;
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->fPhase = 0;
    Abc_NtkForEachLatchOutput( pNtk, pObj, i )
        pObj->fPhase = Abc_LatchIsInit1(pObj);
    Abc_AigForEachAnd( pNtk, pObj, i )
        pObj->fPhase = (Abc_ObjFanin0(pObj)->fPhase ^ Abc_ObjFaninC0(pObj)) & (Abc_ObjFanin1(pObj)->fPhase ^ Abc_ObjFaninC1(pObj));
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->fPhase = (Abc_ObjFanin0(pObj)->fPhase ^ Abc_ObjFaninC0(pObj));
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        pObj->fPhase = (Abc_ObjFanin0(pObj)->fPhase ^ Abc_ObjFaninC0(pObj));
}